

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::torrent_delete_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_delete_failed_alert *this)

{
  error_category *peVar1;
  string sStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&local_58,&local_38," torrent deletion failed: ");
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&sStack_98,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_78,&sStack_98);
  std::operator+(__return_storage_ptr__,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_delete_failed_alert::message() const
	{
		return torrent_alert::message() + " torrent deletion failed: "
			+ convert_from_native(error.message());
	}